

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O1

int xmlParserGrow(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr input;
  xmlParserInputBufferPtr in;
  int iVar1;
  ulong uVar2;
  ulong pos;
  
  input = ctxt->input;
  in = input->buf;
  uVar2 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar2 = 10000000;
  }
  iVar1 = 0;
  if ((in != (xmlParserInputBufferPtr)0x0) && (iVar1 = 0, (input->flags & 0x40) == 0)) {
    pos = (long)input->cur - (long)input->base;
    if ((in->encoder != (xmlCharEncodingHandlerPtr)0x0) ||
       (in->readcallback != (xmlInputReadCallback)0x0)) {
      if (in->error == 0) {
        if (pos <= uVar2) {
          if (0xf9 < (ulong)((long)input->end - (long)input->cur)) {
            return 0;
          }
          iVar1 = xmlParserInputBufferGrow(in,0xfa);
          xmlBufUpdateInput(in->buffer,input,pos);
          if (-1 < iVar1) {
            return iVar1;
          }
          xmlCtxtErrIO(ctxt,in->error,(char *)0x0);
          return iVar1;
        }
        xmlFatalErr(ctxt,XML_ERR_RESOURCE_LIMIT,"Buffer size limit exceeded, try XML_PARSE_HUGE\n");
        if (ctxt != (xmlParserCtxtPtr)0x0) {
          ctxt->instate = XML_PARSER_EOF;
          ctxt->disableSAX = 2;
        }
      }
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int
xmlParserGrow(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in = ctxt->input;
    xmlParserInputBufferPtr buf = in->buf;
    size_t curEnd = in->end - in->cur;
    size_t curBase = in->cur - in->base;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_LOOKUP_LIMIT;
    int ret;

    if (buf == NULL)
        return(0);
    /* Don't grow push parser buffer. */
    if (PARSER_PROGRESSIVE(ctxt))
        return(0);
    /* Don't grow memory buffers. */
    if ((buf->encoder == NULL) && (buf->readcallback == NULL))
        return(0);
    if (buf->error != 0)
        return(-1);

    if (curBase > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT,
                    "Buffer size limit exceeded, try XML_PARSE_HUGE\n");
        xmlHaltParser(ctxt);
	return(-1);
    }

    if (curEnd >= INPUT_CHUNK)
        return(0);

    ret = xmlParserInputBufferGrow(buf, INPUT_CHUNK);
    xmlBufUpdateInput(buf->buffer, in, curBase);

    if (ret < 0) {
        xmlCtxtErrIO(ctxt, buf->error, NULL);
    }

    return(ret);
}